

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

optional<pbrt::CameraRay> * __thiscall
pbrt::SphericalCamera::GenerateRay
          (optional<pbrt::CameraRay> *__return_storage_ptr__,SphericalCamera *this,
          CameraSample sample,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  bool bVar2;
  CameraSample CVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  Point2f p;
  undefined1 auVar9 [16];
  undefined1 extraout_var [56];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  Vector3f VVar15;
  Ray local_80;
  anon_struct_8_0_00000001_for___align local_58;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  undefined8 uStack_44;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_38;
  undefined1 auVar11 [56];
  undefined1 auVar14 [60];
  
  CVar3 = sample;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)((this->super_CameraBase).film.
                            super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                           0xffffffffffff);
  auVar12._8_8_ = 0;
  auVar12._0_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
  auVar12._4_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
  auVar14 = ZEXT460((uint)CVar3.pFilm.super_Tuple2<pbrt::Point2,_float>.y);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vdivps_avx(auVar12,auVar9);
  if (this->mapping == EquiRectangular) {
    auVar12 = vmovshdup_avx(auVar9);
    fVar4 = auVar12._0_4_ * 3.1415927;
    fVar8 = auVar9._0_4_ * 6.2831855;
    fVar6 = sinf(fVar4);
    fVar7 = cosf(fVar4);
    auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar6));
    uVar1 = vcmpss_avx512f(ZEXT416((uint)fVar6),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar2 = (bool)((byte)uVar1 & 1);
    fVar4 = (float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar9._0_4_);
    fVar6 = cosf(fVar8);
    fVar8 = sinf(fVar8);
    auVar9 = vinsertps_avx(ZEXT416((uint)(fVar6 * fVar4)),ZEXT416((uint)(fVar8 * fVar4)),0x10);
    auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar7));
    uVar1 = vcmpss_avx512f(ZEXT416((uint)fVar7),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar2 = (bool)((byte)uVar1 & 1);
    auVar5._4_12_ = auVar12._4_12_;
    auVar5._0_4_ = (uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar12._0_4_;
  }
  else {
    p = WrapEqualAreaSquare(auVar9._0_8_);
    auVar11 = extraout_var;
    VVar15 = EqualAreaSquareToSphere(p);
    auVar13._0_4_ = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar13._4_60_ = auVar14;
    auVar5 = auVar13._0_16_;
    auVar10._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar10._8_56_ = auVar11;
    auVar9 = auVar10._0_16_;
  }
  auVar12 = vinsertps_avx(auVar9,auVar5,0x10);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(sample.time * (this->super_CameraBase).shutterClose)),
                           ZEXT416((uint)(1.0 - sample.time)),
                           ZEXT416((uint)(this->super_CameraBase).shutterOpen));
  local_80.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(this->super_CameraBase).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  local_80.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_80.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_80.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_80.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar12);
  local_80.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)vextractps_avx(auVar9,1);
  local_80.time = auVar5._0_4_;
  AnimatedTransform::operator()((Ray *)&local_58,(AnimatedTransform *)this,&local_80,(Float *)0x0);
  __return_storage_ptr__->set = true;
  (__return_storage_ptr__->optionalValue).__align = local_58;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) = CONCAT44(fStack_4c,fStack_50);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xc) = CONCAT44(fStack_48,fStack_4c);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x14) = uStack_44;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    *)((long)&__return_storage_ptr__->optionalValue + 0x20))->bits = local_38.bits;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0x3f8000003f800000;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0x3f8000003f800000;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRay> SphericalCamera::GenerateRay(CameraSample sample,
                                                       SampledWavelengths &lambda) const {
    // Compute spherical camera ray direction
    Point2f uv(sample.pFilm.x / film.FullResolution().x,
               sample.pFilm.y / film.FullResolution().y);
    Vector3f dir;
    if (mapping == EquiRectangular) {
        // Compute ray direction using equirectangular mapping
        Float theta = Pi * uv[1], phi = 2 * Pi * uv[0];
        dir = SphericalDirection(std::sin(theta), std::cos(theta), phi);

    } else {
        // Compute ray direction using equal area mapping
        uv = WrapEqualAreaSquare(uv);
        dir = EqualAreaSquareToSphere(uv);
    }
    pstd::swap(dir.y, dir.z);

    Ray ray(Point3f(0, 0, 0), dir, SampleTime(sample.time), medium);
    return CameraRay{RenderFromCamera(ray)};
}